

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ManResubTest(Gia_Man_t *p)

{
  Gia_Man_t *p_00;
  abctime aVar1;
  Vec_Wec_t *vMffcs_00;
  abctime aVar2;
  abctime clkStart;
  Gia_Man_t *pNew;
  Vec_Wec_t *vMffcs;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManDupMuxes(p,2);
  aVar1 = Abc_Clock();
  vMffcs_00 = Gia_ManComputeMffcs(p_00,4,100,8,100);
  Gia_ManAddDivisors(p_00,vMffcs_00);
  Vec_WecFree(vMffcs_00);
  aVar2 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar2 - aVar1);
  Gia_ManStop(p_00);
  return;
}

Assistant:

void Gia_ManResubTest( Gia_Man_t * p )
{
    Vec_Wec_t * vMffcs;
    Gia_Man_t * pNew = Gia_ManDupMuxes( p, 2 );
abctime clkStart = Abc_Clock();
    vMffcs = Gia_ManComputeMffcs( pNew, 4, 100, 8, 100 );
    Gia_ManAddDivisors( pNew, vMffcs );
    Vec_WecFree( vMffcs );
Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    Gia_ManStop( pNew );
}